

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModelPrivate::columnsAboutToBeInserted
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  iterator o;
  arrow_operator_result ppQVar5;
  QItemSelectionRange *this_00;
  uint in_EDX;
  long in_FS_OFFSET;
  QModelIndex *itParent;
  QItemSelectionRange right;
  QModelIndex topMiddle;
  QItemSelectionRange left;
  QModelIndex bottomMiddle;
  iterator it;
  QList<QItemSelectionRange> split;
  QModelIndex *in_stack_fffffffffffffe08;
  iterator in_stack_fffffffffffffe10;
  QModelIndex *in_stack_fffffffffffffe20;
  QModelIndex *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  const_iterator pos;
  const_iterator local_e0;
  QItemSelectionRange *local_d8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 local_48 [24];
  iterator local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  finalize((QItemSelectionModelPrivate *)in_stack_fffffffffffffe10.i);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QItemSelectionRange>::QList((QList<QItemSelectionRange> *)0x829055);
  local_30.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QItemSelectionRange>::begin(in_stack_fffffffffffffe10.i);
  do {
    while( true ) {
      o = QList<QItemSelectionRange>::end(in_stack_fffffffffffffe10.i);
      bVar2 = QList<QItemSelectionRange>::iterator::operator!=(&local_30,o);
      if (!bVar2) {
        QList<QItemSelectionRange>::operator+=
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe10.i,
                   (QList<QItemSelectionRange> *)in_stack_fffffffffffffe08);
        QList<QItemSelectionRange>::~QList((QList<QItemSelectionRange> *)0x82956b);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
          __stack_chk_fail();
        }
        return;
      }
      QList<QItemSelectionRange>::iterator::operator->(&local_30);
      QItemSelectionRange::parent(in_stack_fffffffffffffe10.i);
      QList<QItemSelectionRange>::iterator::operator*(&local_30);
      bVar2 = QItemSelectionRange::isValid((QItemSelectionRange *)in_stack_fffffffffffffe28);
      if ((bVar2) &&
         (bVar2 = ::operator==((QModelIndex *)in_stack_fffffffffffffe10.i,in_stack_fffffffffffffe08)
         , bVar2)) break;
LAB_0082952d:
      QList<QItemSelectionRange>::iterator::operator++(&local_30);
    }
    QList<QItemSelectionRange>::iterator::operator*(&local_30);
    iVar3 = QItemSelectionRange::left((QItemSelectionRange *)0x8291b8);
    if ((int)in_EDX <= iVar3) goto LAB_0082952d;
    QList<QItemSelectionRange>::iterator::operator*(&local_30);
    iVar3 = QItemSelectionRange::right((QItemSelectionRange *)0x8291f9);
    if (iVar3 < (int)in_EDX) goto LAB_0082952d;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    ppQVar5 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)in_stack_fffffffffffffe10.i);
    pQVar1 = *ppQVar5;
    QList<QItemSelectionRange>::iterator::operator*(&local_30);
    uVar4 = QItemSelectionRange::bottom((QItemSelectionRange *)0x829274);
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (&local_68,pQVar1,(ulong)uVar4,(ulong)(in_EDX - 1),local_48);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = QList<QItemSelectionRange>::iterator::operator*(&local_30);
    QItemSelectionRange::topLeft(this_00);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffe20);
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    ppQVar5 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)in_stack_fffffffffffffe10.i);
    pos.i = (QItemSelectionRange *)*ppQVar5;
    QList<QItemSelectionRange>::iterator::operator*(&local_30);
    in_stack_fffffffffffffe34 = QItemSelectionRange::top((QItemSelectionRange *)0x829372);
    (*((QObject *)&(pos.i)->tl)->_vptr_QObject[0xc])
              (&local_a8,pos.i,(ulong)in_stack_fffffffffffffe34,(ulong)in_EDX,local_48);
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffe28 =
         (QModelIndex *)QList<QItemSelectionRange>::iterator::operator*(&local_30);
    in_stack_fffffffffffffe20 =
         (QModelIndex *)
         QItemSelectionRange::bottomRight((QItemSelectionRange *)in_stack_fffffffffffffe28);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffe20);
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    QList<QItemSelectionRange>::const_iterator::const_iterator(&local_e0,local_30);
    in_stack_fffffffffffffe10 =
         QList<QItemSelectionRange>::erase
                   ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe20,pos);
    local_d8 = in_stack_fffffffffffffe10.i;
    local_30 = in_stack_fffffffffffffe10;
    QList<QItemSelectionRange>::append
              ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe10.i,
               (parameter_type)in_stack_fffffffffffffe08);
    QList<QItemSelectionRange>::append
              ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe10.i,
               (parameter_type)in_stack_fffffffffffffe08);
    QItemSelectionRange::~QItemSelectionRange(in_stack_fffffffffffffe10.i);
    QItemSelectionRange::~QItemSelectionRange(in_stack_fffffffffffffe10.i);
  } while( true );
}

Assistant:

void QItemSelectionModelPrivate::columnsAboutToBeInserted(const QModelIndex &parent,
                                                             int start, int end)
{
    Q_UNUSED(end);
    finalize();
    QList<QItemSelectionRange> split;
    QList<QItemSelectionRange>::iterator it = ranges.begin();
    for (; it != ranges.end(); ) {
        const QModelIndex &itParent = it->parent();
        if ((*it).isValid() && itParent == parent
            && (*it).left() < start && (*it).right() >= start) {
            QModelIndex bottomMiddle = model->index((*it).bottom(), start - 1, itParent);
            QItemSelectionRange left((*it).topLeft(), bottomMiddle);
            QModelIndex topMiddle = model->index((*it).top(), start, itParent);
            QItemSelectionRange right(topMiddle, (*it).bottomRight());
            it = ranges.erase(it);
            split.append(left);
            split.append(right);
        } else {
            ++it;
        }
    }
    ranges += split;
}